

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcprepct.c
# Opt level: O0

void pre_process_context(j_compress_ptr cinfo,JSAMPARRAY input_buf,JDIMENSION *in_row_ctr,
                        JDIMENSION in_rows_avail,JSAMPIMAGE output_buf,JDIMENSION *out_row_group_ctr
                        ,JDIMENSION out_row_groups_avail)

{
  jpeg_c_prep_controller *pjVar1;
  int iVar2;
  uint uVar3;
  uint local_58;
  int local_54;
  int row;
  JDIMENSION inrows;
  int buf_height;
  int ci;
  int numrows;
  my_prep_ptr prep;
  JDIMENSION *out_row_group_ctr_local;
  JSAMPIMAGE output_buf_local;
  JDIMENSION in_rows_avail_local;
  JDIMENSION *in_row_ctr_local;
  JSAMPARRAY input_buf_local;
  j_compress_ptr cinfo_local;
  
  pjVar1 = cinfo->prep;
  iVar2 = cinfo->max_v_samp_factor * 3;
  do {
    if (out_row_groups_avail <= *out_row_group_ctr) {
      return;
    }
    if (*in_row_ctr < in_rows_avail) {
      local_58 = in_rows_avail - *in_row_ctr;
      uVar3 = *(int *)((long)&pjVar1[6].pre_process_data + 4) -
              *(int *)((long)&pjVar1[6].start_pass + 4);
      if (uVar3 < local_58) {
        local_58 = uVar3;
      }
      (*cinfo->cconvert->color_convert)
                (cinfo,input_buf + *in_row_ctr,(JSAMPIMAGE)(pjVar1 + 1),
                 *(JDIMENSION *)((long)&pjVar1[6].start_pass + 4),local_58);
      if (*(JDIMENSION *)&pjVar1[6].start_pass == cinfo->image_height) {
        for (inrows = 0; (int)inrows < cinfo->num_components; inrows = inrows + 1) {
          for (local_54 = 1; local_54 <= cinfo->max_v_samp_factor; local_54 = local_54 + 1) {
            jcopy_sample_rows((JSAMPARRAY)(&pjVar1[1].start_pass)[(int)inrows],0,
                              (JSAMPARRAY)(&pjVar1[1].start_pass)[(int)inrows],-local_54,1,
                              cinfo->image_width);
          }
        }
      }
      *in_row_ctr = local_58 + *in_row_ctr;
      *(uint *)((long)&pjVar1[6].start_pass + 4) =
           local_58 + *(int *)((long)&pjVar1[6].start_pass + 4);
      *(uint *)&pjVar1[6].start_pass = *(int *)&pjVar1[6].start_pass - local_58;
    }
    else {
      if (*(int *)&pjVar1[6].start_pass != 0) {
        return;
      }
      if (*(int *)((long)&pjVar1[6].start_pass + 4) <
          *(int *)((long)&pjVar1[6].pre_process_data + 4)) {
        for (inrows = 0; (int)inrows < cinfo->num_components; inrows = inrows + 1) {
          expand_bottom_edge((JSAMPARRAY)(&pjVar1[1].start_pass)[(int)inrows],cinfo->image_width,
                             *(int *)((long)&pjVar1[6].start_pass + 4),
                             *(int *)((long)&pjVar1[6].pre_process_data + 4));
        }
        *(undefined4 *)((long)&pjVar1[6].start_pass + 4) =
             *(undefined4 *)((long)&pjVar1[6].pre_process_data + 4);
      }
    }
    if (*(int *)((long)&pjVar1[6].start_pass + 4) == *(int *)((long)&pjVar1[6].pre_process_data + 4)
       ) {
      (*cinfo->downsample->downsample)
                (cinfo,(JSAMPIMAGE)(pjVar1 + 1),*(JDIMENSION *)&pjVar1[6].pre_process_data,
                 output_buf,*out_row_group_ctr);
      *out_row_group_ctr = *out_row_group_ctr + 1;
      *(int *)&pjVar1[6].pre_process_data =
           cinfo->max_v_samp_factor + *(int *)&pjVar1[6].pre_process_data;
      if (iVar2 <= *(int *)&pjVar1[6].pre_process_data) {
        *(undefined4 *)&pjVar1[6].pre_process_data = 0;
      }
      if (iVar2 <= *(int *)((long)&pjVar1[6].start_pass + 4)) {
        *(undefined4 *)((long)&pjVar1[6].start_pass + 4) = 0;
      }
      *(int *)((long)&pjVar1[6].pre_process_data + 4) =
           *(int *)((long)&pjVar1[6].start_pass + 4) + cinfo->max_v_samp_factor;
    }
  } while( true );
}

Assistant:

METHODDEF(void)
pre_process_context (j_compress_ptr cinfo,
		     JSAMPARRAY input_buf, JDIMENSION *in_row_ctr,
		     JDIMENSION in_rows_avail,
		     JSAMPIMAGE output_buf, JDIMENSION *out_row_group_ctr,
		     JDIMENSION out_row_groups_avail)
{
  my_prep_ptr prep = (my_prep_ptr) cinfo->prep;
  int numrows, ci;
  int buf_height = cinfo->max_v_samp_factor * 3;
  JDIMENSION inrows;

  while (*out_row_group_ctr < out_row_groups_avail) {
    if (*in_row_ctr < in_rows_avail) {
      /* Do color conversion to fill the conversion buffer. */
      inrows = in_rows_avail - *in_row_ctr;
      numrows = prep->next_buf_stop - prep->next_buf_row;
      numrows = (int) MIN((JDIMENSION) numrows, inrows);
      (*cinfo->cconvert->color_convert) (cinfo, input_buf + *in_row_ctr,
					 prep->color_buf,
					 (JDIMENSION) prep->next_buf_row,
					 numrows);
      /* Pad at top of image, if first time through */
      if (prep->rows_to_go == cinfo->image_height) {
	for (ci = 0; ci < cinfo->num_components; ci++) {
	  int row;
	  for (row = 1; row <= cinfo->max_v_samp_factor; row++) {
	    jcopy_sample_rows(prep->color_buf[ci], 0,
			      prep->color_buf[ci], -row,
			      1, cinfo->image_width);
	  }
	}
      }
      *in_row_ctr += numrows;
      prep->next_buf_row += numrows;
      prep->rows_to_go -= numrows;
    } else {
      /* Return for more data, unless we are at the bottom of the image. */
      if (prep->rows_to_go != 0)
	break;
      /* When at bottom of image, pad to fill the conversion buffer. */
      if (prep->next_buf_row < prep->next_buf_stop) {
	for (ci = 0; ci < cinfo->num_components; ci++) {
	  expand_bottom_edge(prep->color_buf[ci], cinfo->image_width,
			     prep->next_buf_row, prep->next_buf_stop);
	}
	prep->next_buf_row = prep->next_buf_stop;
      }
    }
    /* If we've gotten enough data, downsample a row group. */
    if (prep->next_buf_row == prep->next_buf_stop) {
      (*cinfo->downsample->downsample) (cinfo,
					prep->color_buf,
					(JDIMENSION) prep->this_row_group,
					output_buf, *out_row_group_ctr);
      (*out_row_group_ctr)++;
      /* Advance pointers with wraparound as necessary. */
      prep->this_row_group += cinfo->max_v_samp_factor;
      if (prep->this_row_group >= buf_height)
	prep->this_row_group = 0;
      if (prep->next_buf_row >= buf_height)
	prep->next_buf_row = 0;
      prep->next_buf_stop = prep->next_buf_row + cinfo->max_v_samp_factor;
    }
  }
}